

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMapDetails::NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>::
transferToRightSib(NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U> *this,uint32_t size,
                  NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U> *sib,uint32_t sibSize
                  ,uint32_t count)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  if (sibSize != 0) {
    uVar3 = (ulong)(sibSize - 1);
    iVar1 = -sibSize;
    do {
      uVar4 = count + (int)uVar3;
      sib->first[uVar4] = sib->first[uVar3];
      sib->second[uVar4] = sib->second[uVar3];
      uVar3 = uVar3 - 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0);
  }
  if (count != 0) {
    lVar2 = 0;
    do {
      uVar4 = (size - count) + (int)lVar2;
      sib->first[lVar2] = this->first[uVar4];
      sib->second[lVar2] = this->second[uVar4];
      lVar2 = lVar2 + 1;
    } while (count != (uint32_t)lVar2);
  }
  return;
}

Assistant:

void transferToRightSib(uint32_t size, NodeBase& sib, uint32_t sibSize, uint32_t count) {
        sib.moveRight(0, count, sibSize);
        sib.copy(*this, size - count, 0, count);
    }